

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname)

{
  global_State *pgVar1;
  size_t sVar2;
  int iVar3;
  ZIO z;
  undefined8 local_68;
  undefined8 uStack_60;
  lua_Reader local_58;
  void *local_50;
  lua_State *local_48;
  undefined1 *local_40;
  void *local_38;
  size_t local_28;
  char *local_20;
  
  local_40 = (undefined1 *)&local_68;
  local_20 = "?";
  if (chunkname != (char *)0x0) {
    local_20 = chunkname;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_38 = (void *)0x0;
  local_28 = 0;
  local_58 = reader;
  local_50 = data;
  local_48 = L;
  iVar3 = luaD_pcall(L,f_parser,&local_40,(long)L->top - (long)L->stack,L->errfunc);
  sVar2 = local_28;
  pgVar1 = L->l_G;
  (*pgVar1->frealloc)(pgVar1->ud,local_38,local_28,0);
  pgVar1->totalbytes = pgVar1->totalbytes - sVar2;
  return iVar3;
}

Assistant:

static int lua_load(lua_State*L,lua_Reader reader,void*data,
const char*chunkname){
ZIO z;
int status;
if(!chunkname)chunkname="?";
luaZ_init(L,&z,reader,data);
status=luaD_protectedparser(L,&z,chunkname);
return status;
}